

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O1

void __thiscall
netbase_tests::netbase_dont_resolve_strings_with_embedded_nul_characters::test_method
          (netbase_dont_resolve_strings_with_embedded_nul_characters *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  DNSLookupFn dns_lookup_function_01;
  DNSLookupFn dns_lookup_function_02;
  _func_int **pp_Var2;
  bool bVar3;
  pointer pcVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  size_type __dnew;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffc5c;
  undefined4 uVar8;
  check_type cVar9;
  _Manager_type in_stack_fffffffffffffc68;
  _Invoker_type in_stack_fffffffffffffc70;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  _Any_data local_208;
  code *local_1f8;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  _Any_data local_168;
  code *local_158;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  lazy_ostream local_108;
  undefined1 *local_f8;
  char **local_f0;
  _Any_data local_e8;
  code *local_d8;
  assertion_result local_c8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  _Storage<CNetAddr,_false> local_90;
  readonly_property<bool> local_70;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1e0;
  file.m_begin = (iterator)&local_a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b0,msg);
  paVar1 = &local_58.field_2;
  local_58.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_58.field_2._M_local_buf[7] = '.';
  local_58.field_2._8_2_ = 0x31;
  local_58._M_string_length = 9;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_e8,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffc5c;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffc58;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = (undefined8)_cVar9;
  dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffffc68;
  dns_lookup_function._M_invoker = in_stack_fffffffffffffc70;
  LookupHost((optional<CNetAddr> *)&local_90._M_value,&local_58,false,dns_lookup_function);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_70.super_class_property<bool>.value;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = &local_118;
  local_118 = "LookupHost(\"127.0.0.1\"s, false).has_value()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_120 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_128,0x1e0);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if ((local_70.super_class_property<bool>.value == true) &&
     (local_70.super_class_property<bool>.value = (class_property<bool>)false,
     0x10 < local_90._M_value.m_addr._size)) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1e1;
  file_00.m_begin = (iterator)&local_138;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_58.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_58.field_2._M_local_buf[7] = '.';
  local_58.field_2._8_2_ = 0x31;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_168,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function_00.super__Function_base._M_functor._4_4_ = uVar8;
  dns_lookup_function_00.super__Function_base._M_functor._0_4_ = uVar7;
  dns_lookup_function_00.super__Function_base._M_functor._8_8_ = (undefined8)_cVar9;
  dns_lookup_function_00.super__Function_base._M_manager = in_stack_fffffffffffffc68;
  dns_lookup_function_00._M_invoker = in_stack_fffffffffffffc70;
  LookupHost((optional<CNetAddr> *)&local_90._M_value,&local_58,false,dns_lookup_function_00);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)local_70.super_class_property<bool>.value ^ 1);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!LookupHost(\"127.0.0.1\\0\"s, false).has_value()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_178,0x1e1);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if ((local_70.super_class_property<bool>.value == true) &&
     (local_70.super_class_property<bool>.value = (class_property<bool>)false,
     0x10 < local_90._M_value.m_addr._size)) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1e2;
  file_01.m_begin = (iterator)&local_188;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_198,
             msg_01);
  local_108._vptr_lazy_ostream = (_func_int **)0x15;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  local_58._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_58,(size_type *)&local_108,0);
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  builtin_strncpy(local_58._M_dataplus._M_p,"127.0.0.1",10);
  builtin_strncpy(local_58._M_dataplus._M_p + 10,"example.com",0xb);
  local_58._M_string_length = (size_type)local_108._vptr_lazy_ostream;
  local_58._M_dataplus._M_p[(long)local_108._vptr_lazy_ostream] = '\0';
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_1b8,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function_01.super__Function_base._M_functor._4_4_ = uVar8;
  dns_lookup_function_01.super__Function_base._M_functor._0_4_ = uVar7;
  dns_lookup_function_01.super__Function_base._M_functor._8_8_ = (undefined8)_cVar9;
  dns_lookup_function_01.super__Function_base._M_manager = in_stack_fffffffffffffc68;
  dns_lookup_function_01._M_invoker = in_stack_fffffffffffffc70;
  LookupHost((optional<CNetAddr> *)&local_90._M_value,&local_58,false,dns_lookup_function_01);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)local_70.super_class_property<bool>.value ^ 1);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!LookupHost(\"127.0.0.1\\0example.com\"s, false).has_value()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1c0 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_1c8,0x1e2);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if ((local_70.super_class_property<bool>.value == true) &&
     (local_70.super_class_property<bool>.value = (class_property<bool>)false,
     0x10 < local_90._M_value.m_addr._size)) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1e3;
  file_02.m_begin = (iterator)&local_1d8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e8,
             msg_02);
  local_108._vptr_lazy_ostream = (_func_int **)0x16;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_58,(size_type *)&local_108,0);
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  builtin_strncpy(local_58._M_dataplus._M_p,"127.0.0.1",10);
  builtin_strncpy(local_58._M_dataplus._M_p + 10,"example.com",0xc);
  local_58._M_string_length = (size_type)local_108._vptr_lazy_ostream;
  local_58._M_dataplus._M_p[(long)local_108._vptr_lazy_ostream] = '\0';
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_208,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function_02.super__Function_base._M_functor._4_4_ = uVar8;
  dns_lookup_function_02.super__Function_base._M_functor._0_4_ = uVar7;
  dns_lookup_function_02.super__Function_base._M_functor._8_8_ = (undefined8)_cVar9;
  dns_lookup_function_02.super__Function_base._M_manager = in_stack_fffffffffffffc68;
  dns_lookup_function_02._M_invoker = in_stack_fffffffffffffc70;
  LookupHost((optional<CNetAddr> *)&local_90._M_value,&local_58,false,dns_lookup_function_02);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)local_70.super_class_property<bool>.value ^ 1);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!LookupHost(\"127.0.0.1\\0example.com\\0\"s, false).has_value()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_210 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  paVar1 = &local_58.field_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_218,0x1e3);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if ((local_70.super_class_property<bool>.value == true) &&
     (local_70.super_class_property<bool>.value = (class_property<bool>)false,
     0x10 < local_90._M_value.m_addr._size)) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1e5;
  file_03.m_begin = (iterator)&local_228;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_238,
             msg_03);
  local_58.field_2._M_allocated_capacity._0_7_ = 0x302e332e322e31;
  local_58.field_2._M_local_buf[7] = '/';
  local_58.field_2._8_2_ = 0x3432;
  local_58._M_string_length = 10;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "LookupSubNet(\"1.2.3.0/24\"s).IsValid()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_240 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_248,0x1e5);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1e6;
  file_04.m_begin = (iterator)&local_258;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_268,
             msg_04);
  local_58.field_2._M_allocated_capacity._0_7_ = 0x302e332e322e31;
  local_58.field_2._M_local_buf[7] = '/';
  local_58.field_2._8_2_ = 0x3432;
  local_58.field_2._M_local_buf[10] = '\0';
  local_58._M_string_length = 0xb;
  local_58.field_2._M_local_buf[0xb] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  bVar3 = CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!LookupSubNet(\"1.2.3.0/24\\0\"s).IsValid()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_270 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_278,0x1e6);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1e7;
  file_05.m_begin = (iterator)&local_288;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_298,
             msg_05);
  local_108._vptr_lazy_ostream = (_func_int **)0x16;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  local_58._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_58,(size_type *)&local_108,0);
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  builtin_strncpy(local_58._M_dataplus._M_p,"1.2.3.0/24",0xb);
  builtin_strncpy(local_58._M_dataplus._M_p + 0xb,"example.com",0xb);
  local_58._M_string_length = (size_type)local_108._vptr_lazy_ostream;
  local_58._M_dataplus._M_p[(long)local_108._vptr_lazy_ostream] = '\0';
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  bVar3 = CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!LookupSubNet(\"1.2.3.0/24\\0example.com\"s).IsValid()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_2a8,0x1e7);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1e8;
  file_06.m_begin = (iterator)&local_2b8;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c8,
             msg_06);
  local_108._vptr_lazy_ostream = (_func_int **)0x17;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_58,(size_type *)&local_108,0);
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  builtin_strncpy(local_58._M_dataplus._M_p,"1.2.3.0/24",0xb);
  builtin_strncpy(local_58._M_dataplus._M_p + 0xb,"example.com",0xc);
  local_58._M_string_length = (size_type)local_108._vptr_lazy_ostream;
  local_58._M_dataplus._M_p[(long)local_108._vptr_lazy_ostream] = '\0';
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  bVar3 = CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!LookupSubNet(\"1.2.3.0/24\\0example.com\\0\"s).IsValid()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2d0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_2d8,0x1e8);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1e9;
  file_07.m_begin = (iterator)&local_2e8;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2f8,
             msg_07);
  local_108._vptr_lazy_ostream = (_func_int **)0x3e;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_58,(size_type *)&local_108,0);
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  builtin_strncpy(local_58._M_dataplus._M_p,
                  "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",0x3e);
  local_58._M_string_length = (size_type)local_108._vptr_lazy_ostream;
  local_58._M_dataplus._M_p[(long)local_108._vptr_lazy_ostream] = '\0';
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "LookupSubNet(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\"s).IsValid()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_300 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_308,0x1e9);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1ea;
  file_08.m_begin = (iterator)&local_318;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_328,
             msg_08);
  local_108._vptr_lazy_ostream = (_func_int **)0x3f;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_58,(size_type *)&local_108,0);
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  builtin_strncpy(local_58._M_dataplus._M_p,
                  "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",0x3f);
  local_58._M_string_length = (size_type)local_108._vptr_lazy_ostream;
  local_58._M_dataplus._M_p[(long)local_108._vptr_lazy_ostream] = '\0';
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  bVar3 = CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "!LookupSubNet(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\\0\"s).IsValid()";
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_330 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_338,0x1ea);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1eb;
  file_09.m_begin = (iterator)&local_348;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_358,
             msg_09);
  local_108._vptr_lazy_ostream = (_func_int **)0x4a;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_58,(size_type *)&local_108,0);
  pp_Var2 = local_108._vptr_lazy_ostream;
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  local_58._M_dataplus._M_p = pcVar4;
  memcpy(pcVar4,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",0x4a);
  local_58._M_string_length = (size_type)pp_Var2;
  pcVar4[(long)pp_Var2] = '\0';
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  bVar3 = CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "!LookupSubNet(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\\0example.com\"s).IsValid()"
  ;
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_360 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&local_368,0x1eb);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1ec;
  file_10.m_begin = (iterator)&local_378;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_388,
             msg_10);
  local_108._vptr_lazy_ostream = (_func_int **)0x4b;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_58,(size_type *)&local_108,0);
  pp_Var2 = local_108._vptr_lazy_ostream;
  local_58.field_2._M_allocated_capacity._0_7_ = SUB87(local_108._vptr_lazy_ostream,0);
  local_58.field_2._M_local_buf[7] = (char)((ulong)local_108._vptr_lazy_ostream >> 0x38);
  local_58._M_dataplus._M_p = pcVar4;
  memcpy(pcVar4,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",0x4b);
  local_58._M_string_length = (size_type)pp_Var2;
  pcVar4[(long)pp_Var2] = '\0';
  LookupSubNet((CSubNet *)&local_90._M_value,&local_58);
  bVar3 = CSubNet::IsValid((CSubNet *)&local_90._M_value);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "!LookupSubNet(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\\0example.com\\0\"s).IsValid()"
  ;
  local_110 = "";
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_108,1,0,WARN,_cVar9,(size_t)&stack0xfffffffffffffc68,0x1ec);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  if (0x10 < local_90._M_value.m_addr._size) {
    free((void *)local_90._0_8_);
    local_90._0_8_ = (void *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             local_58.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_dont_resolve_strings_with_embedded_nul_characters)
{
    BOOST_CHECK(LookupHost("127.0.0.1"s, false).has_value());
    BOOST_CHECK(!LookupHost("127.0.0.1\0"s, false).has_value());
    BOOST_CHECK(!LookupHost("127.0.0.1\0example.com"s, false).has_value());
    BOOST_CHECK(!LookupHost("127.0.0.1\0example.com\0"s, false).has_value());

    BOOST_CHECK(LookupSubNet("1.2.3.0/24"s).IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/24\0"s).IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/24\0example.com"s).IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/24\0example.com\0"s).IsValid());
    BOOST_CHECK(LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"s).IsValid());
    BOOST_CHECK(!LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\0"s).IsValid());
    BOOST_CHECK(!LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\0example.com"s).IsValid());
    BOOST_CHECK(!LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\0example.com\0"s).IsValid());
}